

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

LY_ERR ly_ctx_set_searchdir(ly_ctx *ctx,char *search_dir)

{
  byte *pbVar1;
  uint uVar2;
  lyd_node *plVar3;
  int iVar4;
  LY_ERR LVar5;
  char *__s2;
  int *piVar6;
  char *pcVar7;
  char *format;
  LY_ERR LVar8;
  lyd_node *plVar9;
  long lVar10;
  void *pvVar11;
  void *pvVar12;
  ulong uVar13;
  stat st;
  
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_set_searchdir");
    return LY_EINVAL;
  }
  if (search_dir == (char *)0x0) {
    return LY_SUCCESS;
  }
  __s2 = realpath(search_dir,(char *)0x0);
  if (__s2 == (char *)0x0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    format = "Unable to use search directory \"%s\" (%s).";
LAB_0011a4d3:
    ly_log(ctx,LY_LLERR,LY_ESYS,format,search_dir,pcVar7);
  }
  else {
    iVar4 = strcmp(search_dir,__s2);
    if (iVar4 != 0) {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Search directory string \"%s\" canonized to \"%s\"."
             ,search_dir,__s2);
    }
    iVar4 = access(__s2,5);
    if (iVar4 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      format = "Unable to fully access search directory \"%s\" (%s).";
      search_dir = __s2;
      goto LAB_0011a4d3;
    }
    iVar4 = stat(__s2,(stat *)&st);
    if (iVar4 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      LVar8 = LY_ESYS;
      ly_log(ctx,LY_LLERR,LY_ESYS,"stat() failed for \"%s\" (%s).",__s2,pcVar7);
      goto LAB_0011a4e1;
    }
    if ((st.st_mode & 0xf000) == 0x4000) {
      uVar2 = (ctx->search_paths).count;
      uVar13 = 0;
      LVar8 = LY_EEXIST;
      do {
        if (uVar2 == uVar13) {
          LVar8 = LY_EMEM;
          LVar5 = ly_set_add(&ctx->search_paths,__s2,'\x01',(uint32_t *)0x0);
          if (LVar5 == LY_SUCCESS) {
            for (uVar13 = 0; uVar13 < (ctx->list).count; uVar13 = uVar13 + 1) {
              plVar3 = (ctx->list).field_2.dnodes[uVar13];
              pbVar1 = (byte *)((long)&plVar3[2].schema + 2);
              *pbVar1 = *pbVar1 & 0xfd;
              if ((plVar3[1].next != (lyd_node *)0x0) &&
                 (plVar9 = (plVar3[1].next)->next, plVar9 != (lyd_node *)0x0)) {
                lVar10 = 0;
                pvVar11 = (void *)0x0;
                while( true ) {
                  if (plVar9 == (lyd_node *)0x0) {
                    pvVar12 = (void *)0x0;
                  }
                  else {
                    pvVar12 = plVar9[-1].priv;
                  }
                  if (pvVar12 <= pvVar11) break;
                  pbVar1 = (byte *)(*(long *)((long)&plVar9->hash + lVar10) + 0x79);
                  *pbVar1 = *pbVar1 & 0xf7;
                  pvVar11 = (void *)((long)pvVar11 + 1);
                  plVar9 = (plVar3[1].next)->next;
                  lVar10 = lVar10 + 0x38;
                }
              }
            }
            return LY_SUCCESS;
          }
          break;
        }
        iVar4 = strcmp(__s2,(char *)(ctx->search_paths).field_2.dnodes[uVar13]);
        uVar13 = uVar13 + 1;
      } while (iVar4 != 0);
      goto LAB_0011a4e1;
    }
    ly_log(ctx,LY_LLERR,LY_ESYS,"Given search directory \"%s\" is not a directory.",__s2);
  }
  LVar8 = LY_EINVAL;
LAB_0011a4e1:
  free(__s2);
  return LVar8;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_set_searchdir(struct ly_ctx *ctx, const char *search_dir)
{
    int rc = LY_SUCCESS;
    struct stat st;
    char *new_dir = NULL;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    struct lys_module *mod;

    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);

    if (!search_dir) {
        /* fine, ignore */
        goto cleanup;
    }

    new_dir = realpath(search_dir, NULL);
    if (!new_dir) {
        LOGERR(ctx, LY_ESYS, "Unable to use search directory \"%s\" (%s).", search_dir, strerror(errno)),
        rc = LY_EINVAL;
        goto cleanup;
    }
    if (strcmp(search_dir, new_dir)) {
        LOGVRB("Search directory string \"%s\" canonized to \"%s\".", search_dir, new_dir);
    }

    if (access(new_dir, R_OK | X_OK)) {
        LOGERR(ctx, LY_ESYS, "Unable to fully access search directory \"%s\" (%s).", new_dir, strerror(errno));
        rc = LY_EINVAL;
        goto cleanup;
    }
    if (stat(new_dir, &st)) {
        LOGERR(ctx, LY_ESYS, "stat() failed for \"%s\" (%s).", new_dir, strerror(errno));
        rc = LY_ESYS;
        goto cleanup;
    }
    if (!S_ISDIR(st.st_mode)) {
        LOGERR(ctx, LY_ESYS, "Given search directory \"%s\" is not a directory.", new_dir);
        rc = LY_EINVAL;
        goto cleanup;
    }

    /* avoid path duplication */
    for (i = 0; i < ctx->search_paths.count; ++i) {
        if (!strcmp(new_dir, ctx->search_paths.objs[i])) {
            rc = LY_EEXIST;
            goto cleanup;
        }
    }
    if (ly_set_add(&ctx->search_paths, new_dir, 1, NULL)) {
        rc = LY_EMEM;
        goto cleanup;
    }

    /* new searchdir - reset latests flags (possibly new revisions available) */
    for (i = 0; i < ctx->list.count; ++i) {
        mod = ctx->list.objs[i];

        mod->latest_revision &= ~LYS_MOD_LATEST_SEARCHDIRS;
        if (mod->parsed && mod->parsed->includes) {
            for (u = 0; u < LY_ARRAY_COUNT(mod->parsed->includes); ++u) {
                mod->parsed->includes[u].submodule->latest_revision &= ~LYS_MOD_LATEST_SEARCHDIRS;
            }
        }
    }

cleanup:
    if (rc) {
        free(new_dir);
    }
    return rc;
}